

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_scene.cpp
# Opt level: O2

void __thiscall
FGLInterface::Precache
          (FGLInterface *this,BYTE *texhitlist,
          TMap<PClassActor_*,_bool,_THashTraits<PClassActor_*>,_TValueTraits<bool>_> *actorhitlist)

{
  byte bVar1;
  ushort uVar2;
  FTexture *pFVar3;
  FMaterial *pFVar4;
  PClassActor *ti;
  FModel *pFVar5;
  FModel **ppFVar6;
  spritedef_t *psVar7;
  spriteframe_t *psVar8;
  bool bVar9;
  int iVar10;
  hash_t hVar11;
  ulong *puVar12;
  void *__s;
  void *__s_00;
  FSpriteModelFrame *pFVar13;
  long lVar14;
  int i_1;
  long lVar15;
  int i;
  ulong uVar16;
  ulong uVar17;
  int i_2;
  ulong uVar18;
  uint uVar19;
  TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *pTVar20;
  uint uVar21;
  long lVar22;
  int i_3;
  uint uVar23;
  TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *pTVar24;
  PrecacheProgress precacheProgress;
  cycle_t precacheProfiler;
  Pair *pair;
  Iterator it;
  
  uVar16 = (ulong)sprites.Count;
  puVar12 = (ulong *)operator_new__(uVar16 * 0x18 + 8);
  pTVar20 = (TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)(puVar12 + 1);
  *puVar12 = uVar16;
  if (uVar16 != 0) {
    lVar22 = 0;
    pTVar24 = pTVar20;
    do {
      TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::TMap(pTVar24);
      lVar22 = lVar22 + -0x18;
      pTVar24 = pTVar24 + 1;
    } while (uVar16 * -0x18 - lVar22 != 0);
  }
  uVar18 = (ulong)(int)TexMan.Textures.Count;
  uVar16 = 0xffffffffffffffff;
  if (-1 < (long)uVar18) {
    uVar16 = uVar18 * 8;
  }
  __s = operator_new__(uVar16);
  it.Position = 0;
  uVar16 = (ulong)Models.super_TArray<FModel_*,_FModel_*>.Count;
  it.Map = actorhitlist;
  __s_00 = operator_new__(uVar16);
  memset(__s_00,0,uVar16);
  memset(__s,0,uVar18 * 8);
  for (lVar22 = 0; lVar22 < (int)uVar18; lVar22 = lVar22 + 1) {
    if (((texhitlist[lVar22] & 5) != 0) &&
       (pFVar3 = TexMan.Textures.Array[lVar22].Texture, ((pFVar3->gl_info).field_0x4c & 0x10) != 0))
    {
      for (lVar15 = 0; lVar15 != 6; lVar15 = lVar15 + 1) {
        pFVar4 = pFVar3[1].gl_info.Material[lVar15 + -9];
        if (pFVar4 != (FMaterial *)0x0) {
          iVar10._0_2_ = pFVar4->mRenderWidth;
          iVar10._2_2_ = pFVar4->mRenderHeight;
          texhitlist[iVar10] = texhitlist[iVar10] | 2;
        }
      }
      uVar18 = (ulong)TexMan.Textures.Count;
    }
  }
  while (bVar9 = TMapIterator<PClassActor_*,_bool,_TMap<PClassActor_*,_bool,_THashTraits<PClassActor_*>,_TValueTraits<bool>_>_>
                 ::NextPair(&it,&pair), uVar21 = sprites.Count, bVar9) {
    ti = pair->Key;
    iVar10 = GLTranslationPalette::GetInternalTranslation
                       (*(int *)((ti->super_PClass).Defaults + 0x380));
    for (lVar22 = 0; lVar22 < ti->NumOwnedStates; lVar22 = lVar22 + 1) {
      precacheProgress.m_time = CONCAT31(precacheProgress.m_time._1_3_,1);
      TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::Insert
                (pTVar20 + ti->OwnedStates[lVar22].sprite,iVar10,(bool *)&precacheProgress);
      pFVar13 = gl_FindModelFrame(&ti->super_PClass,(uint)ti->OwnedStates[lVar22].sprite,
                                  (uint)ti->OwnedStates[lVar22].Frame,false);
      if (pFVar13 != (FSpriteModelFrame *)0x0) {
        for (lVar15 = 0; ppFVar6 = Models.super_TArray<FModel_*,_FModel_*>.Array, lVar15 != 4;
            lVar15 = lVar15 + 1) {
          lVar14 = (long)pFVar13->skinIDs[lVar15].texnum;
          if (lVar14 < 1) {
            if ((long)pFVar13->modelIDs[lVar15] != -1) {
              pFVar5 = Models.super_TArray<FModel_*,_FModel_*>.Array[pFVar13->modelIDs[lVar15]];
              pFVar5->curSpriteMDLFrame = pFVar13;
              pFVar5->curMDLIndex = (int)lVar15;
              (*ppFVar6[pFVar13->modelIDs[lVar15]]->_vptr_FModel[6])
                        (ppFVar6[pFVar13->modelIDs[lVar15]],texhitlist);
            }
          }
          else {
            texhitlist[lVar14] = texhitlist[lVar14] | 2;
          }
          if ((long)pFVar13->modelIDs[lVar15] != -1) {
            *(undefined1 *)((long)__s_00 + (long)pFVar13->modelIDs[lVar15]) = 1;
          }
        }
      }
    }
  }
  while (uVar21 = uVar21 - 1, -1 < (int)uVar21) {
    uVar23 = uVar21 & 0x7fffffff;
    hVar11 = TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::CountUsed(pTVar20 + uVar23);
    psVar8 = SpriteFrames.Array;
    psVar7 = sprites.Array;
    if (hVar11 != 0) {
      bVar1 = sprites.Array[uVar23].numframes;
      for (uVar19 = 0; uVar19 != bVar1; uVar19 = uVar19 + 1) {
        uVar2 = psVar7[uVar23].spriteframes;
        for (lVar22 = 0; lVar22 != 0x10; lVar22 = lVar22 + 1) {
          lVar15 = (long)psVar8[uVar2 + uVar19].Texture[lVar22].texnum;
          if (0 < lVar15) {
            *(TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> **)((long)__s + lVar15 * 8) =
                 pTVar20 + uVar23;
          }
        }
      }
    }
  }
  uVar21 = Models.super_TArray<FModel_*,_FModel_*>.Count;
  for (uVar16 = 0; uVar16 < uVar21; uVar16 = uVar16 + 1) {
    if (*(char *)((long)__s_00 + uVar16) == '\0') {
      FModel::DestroyVertexBuffer(Models.super_TArray<FModel_*,_FModel_*>.Array[uVar16]);
      uVar21 = Models.super_TArray<FModel_*,_FModel_*>.Count;
    }
  }
  uVar23 = TexMan.Textures.Count - 1;
  for (uVar21 = uVar23; -1 < (int)uVar21; uVar21 = uVar21 - 1) {
    if (uVar21 < TexMan.Textures.Count) {
      uVar16 = (ulong)uVar21;
      pFVar3 = TexMan.Textures.Array[uVar16].Texture;
      if (pFVar3 != (FTexture *)0x0) {
        if ((texhitlist[uVar16] == '\0') &&
           (pFVar4 = (pFVar3->gl_info).Material[0], pFVar4 != (FMaterial *)0x0)) {
          FMaterial::Clean(pFVar4,true);
        }
        pTVar20 = *(TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> **)
                   ((long)__s + uVar16 * 8);
        if (((pTVar20 == (TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)0x0) ||
            (hVar11 = TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::CountUsed(pTVar20),
            hVar11 == 0)) && (pFVar4 = (pFVar3->gl_info).Material[1], pFVar4 != (FMaterial *)0x0)) {
          FMaterial::Clean(pFVar4,true);
        }
      }
    }
  }
  if (gl_precache.Value != false) {
    precacheProgress.m_time = I_FPSTime();
    precacheProgress.m_color = CR_YELLOW;
    precacheProgress.m_dimmed = false;
    pTVar20 = (TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)&precacheProfiler;
    precacheProfiler.Sec = 0.0;
    cycle_t::Clock((cycle_t *)pTVar20);
    for (; -1 < (int)uVar23; uVar23 = uVar23 - 1) {
      if (uVar23 < TexMan.Textures.Count) {
        uVar16 = (ulong)uVar23;
        pFVar3 = TexMan.Textures.Array[uVar16].Texture;
        if (pFVar3 != (FTexture *)0x0) {
          PrecacheTexture((FGLInterface *)pTVar20,pFVar3,(uint)texhitlist[uVar16]);
          pTVar24 = *(TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> **)
                     ((long)__s + uVar16 * 8);
          if ((pTVar24 != (TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)0x0) &&
             (pTVar20 = pTVar24,
             hVar11 = TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::CountUsed(pTVar24),
             hVar11 != 0)) {
            PrecacheSprite((FGLInterface *)pTVar20,pFVar3,pTVar24);
            pTVar20 = (TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)&precacheProgress;
            anon_unknown.dwarf_28bbd4::PrecacheProgress::Update((PrecacheProgress *)pTVar20);
          }
        }
      }
    }
    uVar21 = Models.super_TArray<FModel_*,_FModel_*>.Count;
    for (uVar16 = 0; uVar16 < uVar21; uVar16 = uVar16 + 1) {
      if (*(char *)((long)__s_00 + uVar16) != '\0') {
        (*Models.super_TArray<FModel_*,_FModel_*>.Array[uVar16]->_vptr_FModel[5])();
        anon_unknown.dwarf_28bbd4::PrecacheProgress::Update(&precacheProgress);
        uVar21 = Models.super_TArray<FModel_*,_FModel_*>.Count;
      }
    }
    cycle_t::Unclock(&precacheProfiler);
    DPrintf(3,"\x1cGTextures were precached in %.03f ms\n",precacheProfiler.Sec * 1000.0);
  }
  operator_delete__(__s);
  uVar17 = *puVar12 * 0x18;
  uVar16 = uVar17;
  uVar18 = *puVar12;
  while (uVar18 != 0) {
    TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::~TMap
              ((TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)
               ((long)puVar12 + (uVar16 - 0x10)));
    uVar16 = uVar16 - 0x18;
    uVar18 = uVar16;
  }
  operator_delete__(puVar12,uVar17 + 8);
  operator_delete__(__s_00);
  return;
}

Assistant:

void FGLInterface::Precache(BYTE *texhitlist, TMap<PClassActor*, bool> &actorhitlist)
{
	SpriteHits *spritelist = new SpriteHits[sprites.Size()];
	SpriteHits **spritehitlist = new SpriteHits*[TexMan.NumTextures()];
	TMap<PClassActor*, bool>::Iterator it(actorhitlist);
	TMap<PClassActor*, bool>::Pair *pair;
	BYTE *modellist = new BYTE[Models.Size()];
	memset(modellist, 0, Models.Size());
	memset(spritehitlist, 0, sizeof(SpriteHits**) * TexMan.NumTextures());

	// this isn't done by the main code so it needs to be done here first:
	// check skybox textures and mark the separate faces as used
	for (int i = 0; i<TexMan.NumTextures(); i++)
	{
		// HIT_Wall must be checked for MBF-style sky transfers. 
		if (texhitlist[i] & (FTextureManager::HIT_Sky | FTextureManager::HIT_Wall))
		{
			FTexture *tex = TexMan.ByIndex(i);
			if (tex->gl_info.bSkybox)
			{
				FSkyBox *sb = static_cast<FSkyBox*>(tex);
				for (int i = 0; i<6; i++)
				{
					if (sb->faces[i])
					{
						int index = sb->faces[i]->id.GetIndex();
						texhitlist[index] |= FTextureManager::HIT_Flat;
					}
				}
			}
		}
	}

	// Check all used actors.
	// 1. mark all sprites associated with its states
	// 2. mark all model data and skins associated with its states
	while (it.NextPair(pair))
	{
		PClassActor *cls = pair->Key;
		int gltrans = GLTranslationPalette::GetInternalTranslation(GetDefaultByType(cls)->Translation);

		for (int i = 0; i < cls->NumOwnedStates; i++)
		{
			spritelist[cls->OwnedStates[i].sprite].Insert(gltrans, true);
			FSpriteModelFrame * smf = gl_FindModelFrame(cls, cls->OwnedStates[i].sprite, cls->OwnedStates[i].Frame, false);
			if (smf != NULL)
			{
				for (int i = 0; i < MAX_MODELS_PER_FRAME; i++)
				{
					if (smf->skinIDs[i].isValid())
					{
						texhitlist[smf->skinIDs[i].GetIndex()] |= FTexture::TEX_Flat;
					}
					else if (smf->modelIDs[i] != -1)
					{
						Models[smf->modelIDs[i]]->PushSpriteMDLFrame(smf, i);
						Models[smf->modelIDs[i]]->AddSkins(texhitlist);
					}
					if (smf->modelIDs[i] != -1)
					{
						modellist[smf->modelIDs[i]] = 1;
					}
				}
			}
		}
	}

	// mark all sprite textures belonging to the marked sprites.
	for (int i = (int)(sprites.Size() - 1); i >= 0; i--)
	{
		if (spritelist[i].CountUsed())
		{
			int j, k;
			for (j = 0; j < sprites[i].numframes; j++)
			{
				const spriteframe_t *frame = &SpriteFrames[sprites[i].spriteframes + j];

				for (k = 0; k < 16; k++)
				{
					FTextureID pic = frame->Texture[k];
					if (pic.isValid())
					{
						spritehitlist[pic.GetIndex()] = &spritelist[i];
					}
				}
			}
		}
	}

	// delete everything unused before creating any new resources to avoid memory usage peaks.

	// delete unused models
	for (unsigned i = 0; i < Models.Size(); i++)
	{
		if (!modellist[i]) Models[i]->DestroyVertexBuffer();
	}

	// delete unused textures
	int cnt = TexMan.NumTextures();
	for (int i = cnt - 1; i >= 0; i--)
	{
		FTexture *tex = TexMan.ByIndex(i);
		if (tex != nullptr)
		{
			if (!texhitlist[i])
			{
				if (tex->gl_info.Material[0]) tex->gl_info.Material[0]->Clean(true);
			}
			if (spritehitlist[i] == nullptr || (*spritehitlist[i]).CountUsed() == 0)
			{
				if (tex->gl_info.Material[1]) tex->gl_info.Material[1]->Clean(true);
			}
		}
	}

	if (gl_precache)
	{
		PrecacheProgress precacheProgress;

		// Consider to comment out PrecacheProgress::Update() call below
		// in order to get more precise timing results
		cycle_t precacheProfiler;
		precacheProfiler.Reset();
		precacheProfiler.Clock();

		// cache all used textures
		for (int i = cnt - 1; i >= 0; i--)
		{
			FTexture *tex = TexMan.ByIndex(i);
			if (tex != nullptr)
			{
				PrecacheTexture(tex, texhitlist[i]);
				if (spritehitlist[i] != nullptr && (*spritehitlist[i]).CountUsed() > 0)
				{
					PrecacheSprite(tex, *spritehitlist[i]);
					precacheProgress.Update();
				}
			}
		}

		// cache all used models
		for (unsigned i = 0; i < Models.Size(); i++)
		{
			if (modellist[i])
			{
				Models[i]->BuildVertexBuffer();
				precacheProgress.Update();
			}
		}

		precacheProfiler.Unclock();
		DPrintf(DMSG_NOTIFY, TEXTCOLOR_RED "Textures were precached in %.03f ms\n", precacheProfiler.TimeMS());
	}

	delete[] spritehitlist;
	delete[] spritelist;
	delete[] modellist;
}